

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

size_t __thiscall v_array<node_pred>::find_sorted(v_array<node_pred> *this,node_pred *ele)

{
  bool bVar1;
  ulong uVar2;
  node_pred *in_RSI;
  long *in_RDI;
  size_t i;
  size_t b;
  size_t a;
  size_t size;
  ulong local_38;
  ulong local_30;
  size_t local_28;
  
  uVar2 = (in_RDI[1] - *in_RDI) / 0x18;
  local_28 = 0;
  local_30 = uVar2;
  local_38 = uVar2;
  while (local_38 = local_38 >> 1, 1 < local_30 - local_28) {
    bVar1 = node_pred::operator<((node_pred *)(*in_RDI + local_38 * 0x18),*in_RSI);
    if (bVar1) {
      local_28 = local_38;
    }
    else {
      bVar1 = node_pred::operator>((node_pred *)(*in_RDI + local_38 * 0x18),*in_RSI);
      if (!bVar1) {
        return local_38;
      }
      local_30 = local_38;
    }
    local_38 = local_28 + local_30;
  }
  if (((uVar2 != 0) &&
      (bVar1 = node_pred::operator>((node_pred *)(*in_RDI + local_28 * 0x18),*in_RSI), !bVar1)) &&
     (bVar1 = node_pred::operator==((node_pred *)(*in_RDI + local_28 * 0x18),*in_RSI), !bVar1)) {
    return local_30;
  }
  return local_28;
}

Assistant:

size_t find_sorted(const T& ele) const  // index of the smallest element >= ele, return true if element is in the
                                          // array
  {
    size_t size = _end - _begin;
    size_t a = 0;
    size_t b = size;
    size_t i = (a + b) / 2;

    while (b - a > 1)
    {
      if (_begin[i] < ele)  // if a = 0, size = 1, if in while we have b - a >= 1 the loop is infinite
        a = i;
      else if (_begin[i] > ele)
        b = i;
      else
        return i;

      i = (a + b) / 2;
    }

    if ((size == 0) || (_begin[a] > ele) || (_begin[a] == ele))  // pusta tablica, nie wchodzi w while
      return a;
    else  // size = 1, ele = 1, _begin[0] = 0
      return b;
  }